

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom JS_NewAtomUInt32(JSContext *ctx,uint32_t n)

{
  size_t buf_len;
  JSAtom JVar1;
  JSValue JVar2;
  char buf [11];
  char local_23 [11];
  
  if ((int)n < 0) {
    JVar1 = 0;
    snprintf(local_23,0xb,"%u");
    buf_len = strlen(local_23);
    JVar2 = JS_NewStringLen(ctx,local_23,buf_len);
    if ((int)JVar2.tag != 6) {
      JVar1 = __JS_NewAtom(ctx->rt,(JSString *)JVar2.u.ptr,1);
    }
  }
  else {
    JVar1 = n | 0x80000000;
  }
  return JVar1;
}

Assistant:

JSAtom JS_NewAtomUInt32(JSContext *ctx, uint32_t n)
{
    if (n <= JS_ATOM_MAX_INT) {
        return __JS_AtomFromUInt32(n);
    } else {
        char buf[11];
        JSValue val;
        snprintf(buf, sizeof(buf), "%u", n);
        val = JS_NewString(ctx, buf);
        if (JS_IsException(val))
            return JS_ATOM_NULL;
        return __JS_NewAtom(ctx->rt, JS_VALUE_GET_STRING(val),
                            JS_ATOM_TYPE_STRING);
    }
}